

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

bool __thiscall
VW::config::options_boost_po::
add_if_t<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  size_t sVar1;
  element_type *peVar2;
  bool bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  size_t sVar4;
  element_type *peVar5;
  shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  sVar1 = ((opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_type_hash;
  sVar4 = std::type_info::hash_code
                    ((type_info *)
                     &std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      typeinfo);
  if (sVar1 != sVar4) goto LAB_00248d6b;
  peVar2 = (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_40.
    super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
LAB_00248d0d:
    local_40.
    super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar3 = true;
  }
  else {
    peVar5 = (element_type *)
             __dynamic_cast(peVar2,&base_option::typeinfo,
                            &typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                             ::typeinfo,0);
    local_40.
    super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    if ((peVar5 == (element_type *)0x0) ||
       (local_40.
        super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,
       local_40.
       super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr = peVar5,
       local_40.
       super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
    goto LAB_00248d0d;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.
       super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_00248d38;
      LOCK();
      (local_40.
       super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.
       super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
LAB_00248d38:
      (local_40.
       super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
    bVar3 = false;
  }
  this_00._M_pi =
       local_40.
       super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  add_to_description<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (this,&local_40,options_description);
  if (local_40.
      super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<VW::config::typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (!bVar3) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
LAB_00248d6b:
  return sVar1 == sVar4;
}

Assistant:

bool options_boost_po::add_if_t(std::shared_ptr<base_option> opt, po::options_description& options_description)
{
  if (opt->m_type_hash == typeid(T).hash_code())
  {
    auto typed = std::dynamic_pointer_cast<typed_option<T>>(opt);
    add_to_description(typed, options_description);
    return true;
  }

  return false;
}